

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_wait(ENetSocket socket,enet_uint32 *condition,enet_uint32 timeout)

{
  int iVar1;
  int *piVar2;
  int in_EDX;
  uint *in_RSI;
  int pollCount;
  pollfd pollSocket;
  pollfd local_1c;
  uint *local_10;
  int local_4;
  
  local_1c.events = 0;
  if ((*in_RSI & 1) != 0) {
    local_1c.events = 4;
  }
  if ((*in_RSI & 2) != 0) {
    local_1c.events = local_1c.events | 1;
  }
  local_10 = in_RSI;
  iVar1 = poll(&local_1c,1,in_EDX);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if ((*piVar2 == 4) && ((*local_10 & 4) != 0)) {
      *local_10 = 4;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    *local_10 = 0;
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      if ((local_1c.revents & 4U) != 0) {
        *local_10 = *local_10 | 1;
      }
      if ((local_1c.revents & 1U) != 0) {
        *local_10 = *local_10 | 2;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
enet_socket_wait (ENetSocket socket, enet_uint32 * condition, enet_uint32 timeout)
{
#ifdef HAS_POLL
    struct pollfd pollSocket;
    int pollCount;
    
    pollSocket.fd = socket;
    pollSocket.events = 0;

    if (* condition & ENET_SOCKET_WAIT_SEND)
      pollSocket.events |= POLLOUT;

    if (* condition & ENET_SOCKET_WAIT_RECEIVE)
      pollSocket.events |= POLLIN;

    pollCount = poll (& pollSocket, 1, timeout);

    if (pollCount < 0)
    {
        if (errno == EINTR && * condition & ENET_SOCKET_WAIT_INTERRUPT)
        {
            * condition = ENET_SOCKET_WAIT_INTERRUPT;

            return 0;
        }

        return -1;
    }

    * condition = ENET_SOCKET_WAIT_NONE;

    if (pollCount == 0)
      return 0;

    if (pollSocket.revents & POLLOUT)
      * condition |= ENET_SOCKET_WAIT_SEND;
    
    if (pollSocket.revents & POLLIN)
      * condition |= ENET_SOCKET_WAIT_RECEIVE;

    return 0;
#else
    fd_set readSet, writeSet;
    struct timeval timeVal;
    int selectCount;

    timeVal.tv_sec = timeout / 1000;
    timeVal.tv_usec = (timeout % 1000) * 1000;

    FD_ZERO (& readSet);
    FD_ZERO (& writeSet);

    if (* condition & ENET_SOCKET_WAIT_SEND)
      FD_SET (socket, & writeSet);

    if (* condition & ENET_SOCKET_WAIT_RECEIVE)
      FD_SET (socket, & readSet);

    selectCount = select (socket + 1, & readSet, & writeSet, NULL, & timeVal);

    if (selectCount < 0)
    {
        if (errno == EINTR && * condition & ENET_SOCKET_WAIT_INTERRUPT)
        {
            * condition = ENET_SOCKET_WAIT_INTERRUPT;

            return 0;
        }
      
        return -1;
    }

    * condition = ENET_SOCKET_WAIT_NONE;

    if (selectCount == 0)
      return 0;

    if (FD_ISSET (socket, & writeSet))
      * condition |= ENET_SOCKET_WAIT_SEND;

    if (FD_ISSET (socket, & readSet))
      * condition |= ENET_SOCKET_WAIT_RECEIVE;

    return 0;
#endif
}